

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void * __thiscall
google::protobuf::Reflection::MutableRawImpl
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32_t offset;
  LogMessage *pLVar2;
  uint32_t field_offset;
  LogMessage local_40;
  Voidify local_29;
  FieldDescriptor *local_28;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  local_28 = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bVar1 = internal::ReflectionSchema::IsSplit(&this->schema_,local_28);
    if (bVar1) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0xb8a,"!schema_.IsSplit(field)");
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar2);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_40);
    }
    offset = internal::ReflectionSchema::GetFieldOffset(&this->schema_,local_28);
    this_local = (Reflection *)internal::GetPointerAtOffset<void>(field_local,offset);
  }
  else {
    this_local = (Reflection *)MutableRawNonOneofImpl(this,(Message *)field_local,local_28);
  }
  return this_local;
}

Assistant:

void* Reflection::MutableRawImpl(Message* message,
                                 const FieldDescriptor* field) const {
  if (ABSL_PREDICT_TRUE(!schema_.InRealOneof(field))) {
    return MutableRawNonOneofImpl(message, field);
  }

  // Oneof fields are not split.
  ABSL_DCHECK(!schema_.IsSplit(field));

  const uint32_t field_offset = schema_.GetFieldOffset(field);
  return GetPointerAtOffset<void>(message, field_offset);
}